

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O2

void __thiscall sglr::ReferenceContext::bindVertexArray(ReferenceContext *this,deUint32 array)

{
  int *piVar1;
  VertexArray *this_00;
  
  if (array == 0) {
    this_00 = (VertexArray *)0x0;
  }
  else {
    this_00 = rc::ObjectManager<sglr::rc::VertexArray>::find(&this->m_vertexArrays,array);
    if (this_00 == (VertexArray *)0x0) {
      this_00 = (VertexArray *)operator_new(0x30);
      rc::VertexArray::VertexArray(this_00,array,(this->m_limits).maxVertexAttribs);
      rc::ObjectManager<sglr::rc::VertexArray>::insert(&this->m_vertexArrays,this_00);
    }
    piVar1 = &(this_00->super_NamedObject).m_refCount;
    *piVar1 = *piVar1 + 1;
  }
  if (this->m_vertexArrayBinding != (VertexArray *)0x0) {
    rc::ObjectManager<sglr::rc::VertexArray>::releaseReference
              (&this->m_vertexArrays,this->m_vertexArrayBinding);
  }
  this->m_vertexArrayBinding = this_00;
  return;
}

Assistant:

void ReferenceContext::bindVertexArray (deUint32 array)
{
	rc::VertexArray* vertexArrayObject = DE_NULL;

	if (array != 0)
	{
		vertexArrayObject = m_vertexArrays.find(array);
		if (!vertexArrayObject)
		{
			vertexArrayObject = new rc::VertexArray(array, m_limits.maxVertexAttribs);
			m_vertexArrays.insert(vertexArrayObject);
		}
	}

	// Create new references
	if (vertexArrayObject)
		m_vertexArrays.acquireReference(vertexArrayObject);

	// Remove old references
	if (m_vertexArrayBinding)
		m_vertexArrays.releaseReference(m_vertexArrayBinding);

	m_vertexArrayBinding = vertexArrayObject;
}